

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.cpp
# Opt level: O0

bool wasm::Bits::isPowerOf2InvertibleFloat(double v)

{
  unsigned_long uVar1;
  ulong uVar2;
  bool local_39;
  unsigned_long u;
  uint64_t SIGN_MASK;
  uint64_t EXP_MASK;
  uint64_t MAX_POT;
  uint64_t MIN_POT;
  double v_local;
  
  MIN_POT = (uint64_t)v;
  uVar1 = bit_cast<unsigned_long,double>((double *)&MIN_POT);
  uVar2 = uVar1 & 0x7fffffffffffffff;
  local_39 = false;
  if ((0xfffffffffffff < uVar2) && (local_39 = false, uVar2 < 0x7fd0000000000001)) {
    local_39 = (uVar1 & 0x7ff0000000000000) == uVar2;
  }
  return local_39;
}

Assistant:

bool isPowerOf2InvertibleFloat(double v) {
  // See isPowerOf2InvertibleFloat(float)
  const uint64_t MIN_POT = 0x001ULL << 52;  // 0x1p-1022
  const uint64_t MAX_POT = 0x7FDULL << 52;  // 0x1p+1022
  const uint64_t EXP_MASK = 0x7FFULL << 52; // mask only exponent
  const uint64_t SIGN_MASK = ~0ULL >> 1;    // mask everything except sign
  auto u = bit_cast<uint64_t>(v) & SIGN_MASK;
  return u >= MIN_POT && u <= MAX_POT && (u & EXP_MASK) == u;
}